

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_cdataSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  ulong uVar1;
  uint local_50;
  uint local_4c;
  uint local_3c;
  size_t n;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (end <= ptr) {
    return -4;
  }
  nextTokPtr_local = (char **)end;
  if (((long)end - (long)ptr & 1U) != 0) {
    uVar1 = (long)end - (long)ptr & 0xfffffffffffffffe;
    if (uVar1 == 0) {
      return -1;
    }
    nextTokPtr_local = (char **)(ptr + uVar1);
  }
  if (ptr[1] == '\0') {
    local_3c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  }
  else {
    local_3c = unicode_byte_type(ptr[1],*ptr);
  }
  switch(local_3c) {
  case 0:
  case 1:
  case 8:
    *nextTokPtr = ptr;
    return 0;
  default:
    end_local = ptr + 2;
    break;
  case 4:
    end_local = ptr + 2;
    if ((long)nextTokPtr_local - (long)end_local < 2) {
      return -1;
    }
    if ((ptr[3] == '\0') && (*end_local == ']')) {
      if ((long)nextTokPtr_local - (long)(ptr + 4) < 2) {
        return -1;
      }
      if ((ptr[5] == '\0') && (ptr[4] == '>')) {
        *nextTokPtr = ptr + 6;
        return 0x28;
      }
      end_local = ptr + 2;
    }
    break;
  case 5:
    if ((long)nextTokPtr_local - (long)ptr < 2) {
      return -2;
    }
    end_local = ptr + 2;
    break;
  case 6:
    if ((long)nextTokPtr_local - (long)ptr < 3) {
      return -2;
    }
    end_local = ptr + 3;
    break;
  case 7:
    if ((long)nextTokPtr_local - (long)ptr < 4) {
      return -2;
    }
    end_local = ptr + 4;
    break;
  case 9:
    end_local = ptr + 2;
    if ((long)nextTokPtr_local - (long)end_local < 2) {
      return -1;
    }
    if (ptr[3] == '\0') {
      local_4c = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
    }
    else {
      local_4c = unicode_byte_type(ptr[3],*end_local);
    }
    if (local_4c == 10) {
      end_local = ptr + 4;
    }
    *nextTokPtr = end_local;
    return 7;
  case 10:
    *nextTokPtr = ptr + 2;
    return 7;
  }
  do {
    if ((long)nextTokPtr_local - (long)end_local < 2) {
      *nextTokPtr = end_local;
      return 6;
    }
    if (end_local[1] == '\0') {
      local_50 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
    }
    else {
      local_50 = unicode_byte_type(end_local[1],*end_local);
    }
    switch(local_50) {
    case 0:
    case 1:
    case 4:
    case 8:
    case 9:
    case 10:
      *nextTokPtr = end_local;
      return 6;
    default:
      end_local = end_local + 2;
      break;
    case 5:
      if ((long)nextTokPtr_local - (long)end_local < 2) {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 2;
      break;
    case 6:
      if ((long)nextTokPtr_local - (long)end_local < 3) {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 3;
      break;
    case 7:
      if ((long)nextTokPtr_local - (long)end_local < 4) {
        *nextTokPtr = end_local;
        return 6;
      }
      end_local = end_local + 4;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(cdataSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr) {
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_RSQB:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (! CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (! CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_CDATA_SECT_CLOSE;
  case BT_CR:
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
    INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) {                       \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_DATA_CHARS;                                               \
    }                                                                          \
    ptr += n;                                                                  \
    break;
      LEAD_CASE(2)
      LEAD_CASE(3)
      LEAD_CASE(4)
#  undef LEAD_CASE
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
    case BT_RSQB:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}